

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.c
# Opt level: O2

ztresult_t bandmember_saver(void *pvoidval,char *buf,size_t bufsz)

{
  char **ppcVar1;
  long lVar2;
  
  ppcVar1 = popular_beat_combo;
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 4) {
      return 0x80;
    }
    if (*ppcVar1 == *pvoidval) break;
    lVar2 = lVar2 + 1;
    ppcVar1 = ppcVar1 + 1;
  }
  sprintf(buf,"%d");
  return 0;
}

Assistant:

static ztresult_t bandmember_saver(const void *pvoidval,
                                   char       *buf,
                                   size_t      bufsz)
{
  const char **ppcharval = (const char **) pvoidval;
  int          i;

  for (i = 0; i < NELEMS(popular_beat_combo); i++)
    if (popular_beat_combo[i] == *ppcharval)
      break;
  if (i == NELEMS(popular_beat_combo))
    return ztresult_BAD_POINTER;

  sprintf(buf, "%d", i);
  return ztresult_OK;
}